

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler)

{
  long lVar1;
  xmlCharEncodingHandlerPtr handler_local;
  
  if (handler != (xmlCharEncodingHandlerPtr)0x0) {
    if (((globalHandlers == (xmlCharEncodingHandlerPtr *)0x0) &&
        (globalHandlers = (xmlCharEncodingHandlerPtr *)(*xmlMalloc)(400),
        globalHandlers == (xmlCharEncodingHandlerPtr *)0x0)) || (0x31 < nbCharEncodingHandler)) {
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        if (handler->name != (char *)0x0) {
          (*xmlFree)(handler->name);
        }
        (*xmlFree)(handler);
      }
    }
    else {
      lVar1 = (long)nbCharEncodingHandler;
      nbCharEncodingHandler = nbCharEncodingHandler + 1;
      globalHandlers[lVar1] = handler;
    }
  }
  return;
}

Assistant:

void
xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler) {
    if (handler == NULL)
        return;
    if (globalHandlers == NULL) {
        globalHandlers = xmlMalloc(
                MAX_ENCODING_HANDLERS * sizeof(globalHandlers[0]));
        if (globalHandlers == NULL)
            goto free_handler;
    }

    if (nbCharEncodingHandler >= MAX_ENCODING_HANDLERS)
        goto free_handler;
    globalHandlers[nbCharEncodingHandler++] = handler;
    return;

free_handler:
    if (handler != NULL) {
        if (handler->name != NULL) {
            xmlFree(handler->name);
        }
        xmlFree(handler);
    }
}